

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void panel_line(panel *p,uint8_t attr,char *label,char *fmt,...)

{
  size_t sVar1;
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_108 [32];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  panel_line *local_50;
  panel_line *pl;
  va_list vp;
  char *fmt_local;
  char *label_local;
  uint8_t attr_local;
  panel *p_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  local_e8 = in_R8;
  local_e0 = in_R9;
  if (p != (panel *)0x0) {
    if (p->len != p->max) {
      sVar1 = p->len;
      p->len = sVar1 + 1;
      local_50 = p->lines + sVar1;
      local_50->attr = attr;
      local_50->label = label;
      vp[0].overflow_arg_area = local_108;
      vp[0]._0_8_ = &stack0x00000008;
      pl._4_4_ = 0x30;
      pl._0_4_ = 0x20;
      vstrnfmt(local_50->value,0x14,fmt,(__va_list_tag *)&pl);
      return;
    }
    __assert_fail("p->len != p->max",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-player.c"
                  ,0x65,"void panel_line(struct panel *, uint8_t, const char *, const char *, ...)")
    ;
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-player.c"
                ,100,"void panel_line(struct panel *, uint8_t, const char *, const char *, ...)");
}

Assistant:

static void panel_line(struct panel *p, uint8_t attr, const char *label,
		const char *fmt, ...) {
	va_list vp;

	struct panel_line *pl;

	/* Get the next panel line */
	assert(p);
	assert(p->len != p->max);
	pl = &p->lines[p->len++];

	/* Set the basics */
	pl->attr = attr;
	pl->label = label;

	/* Set the value */
	va_start(vp, fmt);
	vstrnfmt(pl->value, sizeof pl->value, fmt, vp);
	va_end(vp);
}